

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

sample * __thiscall
Catch::Benchmark::Detail::
jackknife<double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>),__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
          (sample *__return_storage_ptr__,Detail *this,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  bool bVar1;
  value_type_conflict5 local_70;
  double *local_68;
  double *local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> it;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> second;
  difference_type n;
  _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  sample *results;
  
  estimator_local =
       (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
        **)first._M_current;
  last_local._M_current = (double *)estimator;
  second._M_current =
       (double *)
       __gnu_cxx::operator-
                 ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  &estimator_local,&last_local);
  local_38._M_current = last_local._M_current;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator++
            (&local_38);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,(size_type)second._M_current);
  local_58._M_current = last_local._M_current;
  while (bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                           (&local_58,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&estimator_local), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = local_58._M_current;
    local_68 = last_local._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (local_58,last_local);
    local_70 = (value_type_conflict5)(**(code **)this)(local_38._M_current,estimator_local);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_70);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

sample jackknife(Estimator&& estimator, Iterator first, Iterator last) {
                auto n = last - first;
                auto second = first;
                ++second;
                sample results;
                results.reserve(n);

                for (auto it = first; it != last; ++it) {
                    std::iter_swap(it, first);
                    results.push_back(estimator(second, last));
                }

                return results;
            }